

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RippleOP.cpp
# Opt level: O0

void __thiscall
OpenMD::RippleOP::RippleOP
          (RippleOP *this,SimInfo *info,string *filename,string *sele1,string *sele2)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  string *in_RCX;
  SelectionManager *this_00;
  undefined8 *in_RDI;
  string *in_R8;
  pair<OpenMD::StuntDouble_*,_OpenMD::StuntDouble_*> pVar4;
  StuntDouble *sd2;
  StuntDouble *sd1;
  int j;
  int i;
  SimInfo *in_stack_00000108;
  SelectionManager *in_stack_00000110;
  StuntDouble *in_stack_fffffffffffffe58;
  StaticAnalyser *in_stack_fffffffffffffe60;
  SimInfo *in_stack_fffffffffffffe68;
  int *i_00;
  StaticAnalyser *in_stack_fffffffffffffe70;
  SelectionEvaluator *in_stack_fffffffffffffe98;
  errorStruct *peVar5;
  string *in_stack_fffffffffffffea8;
  SelectionEvaluator *in_stack_fffffffffffffeb0;
  StuntDouble *local_c0;
  StaticAnalyser *local_b8;
  SimInfo *in_stack_ffffffffffffff58;
  SelectionEvaluator *in_stack_ffffffffffffff60;
  string local_78 [32];
  string local_58 [48];
  string *local_28;
  string *local_20;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  StaticAnalyser::StaticAnalyser
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,(string *)in_stack_fffffffffffffe60
             ,(uint)((ulong)in_stack_fffffffffffffe58 >> 0x20));
  *in_RDI = &PTR__RippleOP_0055fe98;
  std::__cxx11::string::string((string *)(in_RDI + 0x1a),local_20);
  std::__cxx11::string::string((string *)(in_RDI + 0x1e),local_28);
  SelectionManager::SelectionManager(in_stack_00000110,in_stack_00000108);
  SelectionManager::SelectionManager(in_stack_00000110,in_stack_00000108);
  SelectionEvaluator::SelectionEvaluator(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  SelectionEvaluator::SelectionEvaluator(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::
  vector<std::pair<OpenMD::StuntDouble_*,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<OpenMD::StuntDouble_*,_OpenMD::StuntDouble_*>_>_>
  ::vector((vector<std::pair<OpenMD::StuntDouble_*,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<OpenMD::StuntDouble_*,_OpenMD::StuntDouble_*>_>_>
            *)0x1a3583);
  std::vector<OpenMD::RippleOP::OrderParam,_std::allocator<OpenMD::RippleOP::OrderParam>_>::vector
            ((vector<OpenMD::RippleOP::OrderParam,_std::allocator<OpenMD::RippleOP::OrderParam>_> *)
             0x1a359f);
  std::vector<OpenMD::RippleOP::OrderParam,_std::allocator<OpenMD::RippleOP::OrderParam>_>::vector
            ((vector<OpenMD::RippleOP::OrderParam,_std::allocator<OpenMD::RippleOP::OrderParam>_> *)
             0x1a35bb);
  std::vector<OpenMD::RippleOP::OrderParam,_std::allocator<OpenMD::RippleOP::OrderParam>_>::vector
            ((vector<OpenMD::RippleOP::OrderParam,_std::allocator<OpenMD::RippleOP::OrderParam>_> *)
             0x1a35d7);
  OrderParam::OrderParam((OrderParam *)0x1a35eb);
  OrderParam::OrderParam((OrderParam *)0x1a3601);
  OrderParam::OrderParam((OrderParam *)0x1a3617);
  OrderParam::OrderParam((OrderParam *)0x1a362d);
  OrderParam::OrderParam((OrderParam *)0x1a3643);
  OrderParam::OrderParam((OrderParam *)0x1a3659);
  getPrefix((string *)in_stack_fffffffffffffe68);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe68,(char *)in_stack_fffffffffffffe60);
  StaticAnalyser::setOutputName(in_stack_fffffffffffffe60,(string *)in_stack_fffffffffffffe58);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_78);
  SelectionEvaluator::loadScriptString(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  SelectionEvaluator::loadScriptString(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  bVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x54));
  if (bVar1) {
    snprintf(painCave.errMsg,2000,"--sele1 must be static selection\n");
    painCave.severity = 1;
    painCave.isFatal = 1;
    simError();
  }
  else {
    SelectionEvaluator::evaluate(in_stack_fffffffffffffe98);
    SelectionManager::setSelectionSet
              ((SelectionManager *)in_stack_fffffffffffffe70,
               (SelectionSet *)in_stack_fffffffffffffe68);
    SelectionSet::~SelectionSet((SelectionSet *)0x1a3772);
  }
  bVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0xfe));
  if (bVar1) {
    peVar5 = &painCave;
    snprintf(painCave.errMsg,2000,"--sele2 must be static selection\n");
    peVar5->severity = 1;
    peVar5->isFatal = 1;
    simError();
  }
  else {
    SelectionEvaluator::evaluate(in_stack_fffffffffffffe98);
    SelectionManager::setSelectionSet
              ((SelectionManager *)in_stack_fffffffffffffe70,
               (SelectionSet *)in_stack_fffffffffffffe68);
    SelectionSet::~SelectionSet((SelectionSet *)0x1a3947);
  }
  iVar2 = SelectionManager::getSelectionCount((SelectionManager *)0x1a39c4);
  iVar3 = SelectionManager::getSelectionCount((SelectionManager *)0x1a39de);
  if (iVar2 != iVar3) {
    peVar5 = &painCave;
    snprintf(painCave.errMsg,2000,
             "The number of selected Stuntdoubles are not the same in --sele1 and sele2\n");
    peVar5->severity = 1;
    peVar5->isFatal = 1;
    simError();
  }
  local_b8 = (StaticAnalyser *)
             SelectionManager::beginSelected
                       ((SelectionManager *)in_stack_fffffffffffffe70,
                        (int *)in_stack_fffffffffffffe68);
  local_c0 = SelectionManager::beginSelected
                       ((SelectionManager *)in_stack_fffffffffffffe70,
                        (int *)in_stack_fffffffffffffe68);
  while (local_b8 != (StaticAnalyser *)0x0 && local_c0 != (StuntDouble *)0x0) {
    i_00 = (int *)(in_RDI + 0x1a8);
    pVar4 = std::make_pair<OpenMD::StuntDouble*&,OpenMD::StuntDouble*&>
                      ((StuntDouble **)in_stack_fffffffffffffe60,
                       (StuntDouble **)in_stack_fffffffffffffe58);
    this_00 = (SelectionManager *)pVar4.second;
    std::
    vector<std::pair<OpenMD::StuntDouble_*,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<OpenMD::StuntDouble_*,_OpenMD::StuntDouble_*>_>_>
    ::push_back((vector<std::pair<OpenMD::StuntDouble_*,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<OpenMD::StuntDouble_*,_OpenMD::StuntDouble_*>_>_>
                 *)in_stack_fffffffffffffe60,(value_type *)in_stack_fffffffffffffe58);
    local_b8 = (StaticAnalyser *)SelectionManager::nextSelected(this_00,i_00);
    in_stack_fffffffffffffe60 = local_b8;
    in_stack_fffffffffffffe58 = SelectionManager::nextSelected(this_00,i_00);
    local_c0 = in_stack_fffffffffffffe58;
  }
  return;
}

Assistant:

RippleOP::RippleOP(SimInfo* info, const std::string& filename,
                     const std::string& sele1, const std::string& sele2) :
      StaticAnalyser(info, filename, 1),
      selectionScript1_(sele1), selectionScript2_(sele2), seleMan1_(info),
      seleMan2_(info), evaluator1_(info), evaluator2_(info) {
    setOutputName(getPrefix(filename) + ".rp2");

    evaluator1_.loadScriptString(sele1);
    evaluator2_.loadScriptString(sele2);

    if (!evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "--sele1 must be static selection\n");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    if (!evaluator2_.isDynamic()) {
      seleMan2_.setSelectionSet(evaluator2_.evaluate());
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "--sele2 must be static selection\n");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    if (seleMan1_.getSelectionCount() != seleMan2_.getSelectionCount()) {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "The number of selected Stuntdoubles are not the same in --sele1 "
          "and sele2\n");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    int i;
    int j;
    StuntDouble* sd1;
    StuntDouble* sd2;
    for (sd1 = seleMan1_.beginSelected(i), sd2 = seleMan2_.beginSelected(j);
         sd1 != NULL && sd2 != NULL;
         sd1 = seleMan1_.nextSelected(i), sd2 = seleMan2_.nextSelected(j)) {
      sdPairs_.push_back(std::make_pair(sd1, sd2));
    }
  }